

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtransaction.cpp
# Opt level: O2

void __thiscall
ConfidentialTransaction_SetUnlockingScriptTest_Test::TestBody
          (ConfidentialTransaction_SetUnlockingScriptTest_Test *this)

{
  Script *object;
  _Alloc_hider lhs;
  bool bVar1;
  _func_int *message;
  char *pcVar2;
  uint32_t index;
  string local_390;
  ByteData exp_data2;
  AssertionResult gtest_ar_2;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> exp_list;
  ByteData exp_data1;
  ConfidentialTxInReference local_310;
  ConfidentialTransaction tx;
  ConfidentialTxInReference txin_ref;
  
  cfd::core::ConfidentialTransaction::ConfidentialTransaction(&tx,&exp_tx_hex_abi_cxx11_);
  index = 0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      index = cfd::core::ConfidentialTransaction::AddTxIn
                        (&tx,&exp_txid,2,0xfffffffe,(Script *)cfd::core::Script::Empty);
    }
  }
  else {
    testing::Message::Message((Message *)&txin_ref);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_310,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x24c,
               "Expected: (index = tx.AddTxIn(exp_txid, exp_index, exp_sequence)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_310,(Message *)&txin_ref);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_310);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&txin_ref);
  }
  local_310.super_AbstractTxInReference._vptr_AbstractTxInReference._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&txin_ref,"index","1",&index,(int *)&local_310);
  if ((char)txin_ref.super_AbstractTxInReference._vptr_AbstractTxInReference == '\0') {
    testing::Message::Message((Message *)&local_310);
    if (txin_ref.super_AbstractTxInReference.txid_._vptr_Txid == (_func_int **)0x0) {
      message = (_func_int *)0x4d37ee;
    }
    else {
      message = *txin_ref.super_AbstractTxInReference.txid_._vptr_Txid;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_390,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x24d,(char *)message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_390,(Message *)&local_310);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_390);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_310);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&txin_ref.super_AbstractTxInReference.txid_);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    cfd::core::ConfidentialTransaction::SetUnlockingScript(&tx,index + 5,&exp_script);
  }
  testing::Message::Message((Message *)&txin_ref);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_310,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
             ,0x250,
             "Expected: (tx.SetUnlockingScript(index + 5, exp_script)) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_310,(Message *)&txin_ref);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_310);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&txin_ref);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ConfidentialTransaction::SetUnlockingScript(&tx,index,&exp_script);
    }
  }
  else {
    testing::Message::Message((Message *)&txin_ref);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_310,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x251,
               "Expected: (tx.SetUnlockingScript(index, exp_script)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_310,(Message *)&txin_ref);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_310);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&txin_ref);
  }
  cfd::core::ConfidentialTxInReference::ConfidentialTxInReference(&txin_ref);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ConfidentialTransaction::GetTxIn(&local_310,&tx,1);
      cfd::core::ConfidentialTxInReference::operator=(&txin_ref,&local_310);
      cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference(&local_310);
    }
  }
  else {
    testing::Message::Message((Message *)&local_310);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_390,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x254,
               "Expected: (txin_ref = tx.GetTxIn(1)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_390,(Message *)&local_310);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_390);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_310);
  }
  object = &txin_ref.super_AbstractTxInReference.unlocking_script_;
  cfd::core::Script::Script((Script *)&local_310,object);
  cfd::core::Script::GetHex_abi_cxx11_(&local_390,(Script *)&local_310);
  lhs._M_p = local_390._M_dataplus._M_p;
  cfd::core::Script::GetHex_abi_cxx11_((string *)&exp_data1,&exp_script);
  testing::internal::CmpHelperSTREQ
            ((internal *)&exp_data2,"txin_ref.GetUnlockingScript().GetHex().c_str()",
             "exp_script.GetHex().c_str()",lhs._M_p,
             (char *)exp_data1.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start);
  std::__cxx11::string::~string((string *)&exp_data1);
  std::__cxx11::string::~string((string *)&local_390);
  cfd::core::Script::~Script((Script *)&local_310);
  if ((char)exp_data2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&local_310);
    if (exp_data2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)exp_data2.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_390,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x256,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_390,(Message *)&local_310);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_390);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_310);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&exp_data2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish);
  std::__cxx11::string::string((string *)&local_310,"1234567890",(allocator *)&local_390);
  cfd::core::ByteData::ByteData(&exp_data1,(string *)&local_310);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::string
            ((string *)&local_310,"1234567890123456789012345678901234567890",(allocator *)&local_390
            );
  cfd::core::ByteData::ByteData(&exp_data2,(string *)&local_310);
  std::__cxx11::string::~string((string *)&local_310);
  exp_list.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  exp_list.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  exp_list.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::push_back
            (&exp_list,&exp_data1);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::push_back
            (&exp_list,&exp_data2);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    cfd::core::ConfidentialTransaction::SetUnlockingScript(&tx,index + 5,&exp_list);
  }
  testing::Message::Message((Message *)&local_310);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_390,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
             ,0x25e,
             "Expected: (tx.SetUnlockingScript(index + 5, exp_list)) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_390,(Message *)&local_310);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_390);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_310);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ConfidentialTransaction::SetUnlockingScript(&tx,index,&exp_list);
    }
  }
  else {
    testing::Message::Message((Message *)&local_310);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_390,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x25f,
               "Expected: (tx.SetUnlockingScript(index, exp_list)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_390,(Message *)&local_310);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_390);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_310);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ConfidentialTransaction::GetTxIn(&local_310,&tx,1);
      cfd::core::ConfidentialTxInReference::operator=(&txin_ref,&local_310);
      cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference(&local_310);
    }
  }
  else {
    testing::Message::Message((Message *)&local_310);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_390,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x261,
               "Expected: (txin_ref = tx.GetTxIn(1)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_390,(Message *)&local_310);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_390);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_310);
  }
  cfd::core::Script::Script((Script *)&local_310,object);
  cfd::core::Script::GetHex_abi_cxx11_(&local_390,(Script *)&local_310);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"txin_ref.GetUnlockingScript().GetHex().c_str()",
             "\"051234567890141234567890123456789012345678901234567890\"",local_390._M_dataplus._M_p
             ,"051234567890141234567890123456789012345678901234567890");
  std::__cxx11::string::~string((string *)&local_390);
  cfd::core::Script::~Script((Script *)&local_310);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&local_310);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_390,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x263,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_390,(Message *)&local_310);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_390);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_310);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&exp_list);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&exp_data2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&exp_data1);
  cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference(&txin_ref);
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction(&tx);
  return;
}

Assistant:

TEST(ConfidentialTransaction, SetUnlockingScriptTest) {
  ConfidentialTransaction tx(exp_tx_hex);
  uint32_t index = 0;
  EXPECT_NO_THROW((index = tx.AddTxIn(exp_txid, exp_index, exp_sequence)));
  EXPECT_EQ(index, 1);

  // SetUnlockingScript
  EXPECT_THROW((tx.SetUnlockingScript(index + 5, exp_script)), CfdException);
  EXPECT_NO_THROW((tx.SetUnlockingScript(index, exp_script)));

  ConfidentialTxInReference txin_ref;
  EXPECT_NO_THROW((txin_ref = tx.GetTxIn(1)));
  EXPECT_STREQ(txin_ref.GetUnlockingScript().GetHex().c_str(),
               exp_script.GetHex().c_str());

  // SetUnlockingScript2
  const ByteData exp_data1("1234567890");
  const ByteData exp_data2("1234567890123456789012345678901234567890");
  std::vector<ByteData> exp_list;
  exp_list.push_back(exp_data1);
  exp_list.push_back(exp_data2);
  EXPECT_THROW((tx.SetUnlockingScript(index + 5, exp_list)), CfdException);
  EXPECT_NO_THROW((tx.SetUnlockingScript(index, exp_list)));

  EXPECT_NO_THROW((txin_ref = tx.GetTxIn(1)));
  EXPECT_STREQ(txin_ref.GetUnlockingScript().GetHex().c_str(),
               "051234567890141234567890123456789012345678901234567890");
}